

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

bool __thiscall
btSoftBody::checkContact
          (btSoftBody *this,btCollisionObjectWrapper *colObjWrap,btVector3 *x,btScalar margin,
          sCti *cti)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  btTransform *pbVar4;
  undefined1 auVar5 [16];
  btScalar bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  btVector3 nrm;
  btVector3 local_40;
  btVector3 local_30;
  
  pbVar4 = colObjWrap->m_worldTransform;
  fVar7 = x->m_floats[0] - (pbVar4->m_origin).m_floats[0];
  fVar8 = x->m_floats[1] - (pbVar4->m_origin).m_floats[1];
  fVar9 = x->m_floats[2] - (pbVar4->m_origin).m_floats[2];
  uVar1 = *(undefined8 *)(pbVar4->m_basis).m_el[0].m_floats;
  uVar2 = *(undefined8 *)(pbVar4->m_basis).m_el[1].m_floats;
  uVar3 = *(undefined8 *)(pbVar4->m_basis).m_el[2].m_floats;
  local_30.m_floats[1] =
       fVar9 * (float)((ulong)uVar3 >> 0x20) +
       fVar7 * (float)((ulong)uVar1 >> 0x20) + fVar8 * (float)((ulong)uVar2 >> 0x20);
  local_30.m_floats[0] = fVar9 * (float)uVar3 + fVar7 * (float)uVar1 + fVar8 * (float)uVar2;
  local_30.m_floats[2] =
       fVar9 * (pbVar4->m_basis).m_el[2].m_floats[2] +
       fVar7 * (pbVar4->m_basis).m_el[0].m_floats[2] + fVar8 * (pbVar4->m_basis).m_el[1].m_floats[2]
  ;
  local_30.m_floats[3] = 0.0;
  bVar6 = btSparseSdf<3>::Evaluate
                    (&this->m_worldInfo->m_sparsesdf,&local_30,colObjWrap->m_shape,&local_40,margin)
  ;
  if (bVar6 < 0.0) {
    cti->m_colObj = colObjWrap->m_collisionObject;
    fVar8 = local_40.m_floats[2] * (pbVar4->m_basis).m_el[0].m_floats[2] +
            local_40.m_floats[0] * (pbVar4->m_basis).m_el[0].m_floats[0] +
            (pbVar4->m_basis).m_el[0].m_floats[1] * local_40.m_floats[1];
    fVar9 = local_40.m_floats[2] * (pbVar4->m_basis).m_el[1].m_floats[2] +
            local_40.m_floats[0] * (pbVar4->m_basis).m_el[1].m_floats[0] +
            (pbVar4->m_basis).m_el[1].m_floats[1] * local_40.m_floats[1];
    fVar7 = local_40.m_floats[2] * (pbVar4->m_basis).m_el[2].m_floats[2] +
            local_40.m_floats[0] * (pbVar4->m_basis).m_el[2].m_floats[0] +
            local_40.m_floats[1] * (pbVar4->m_basis).m_el[2].m_floats[1];
    auVar5._4_4_ = fVar9;
    auVar5._0_4_ = fVar8;
    auVar5._8_4_ = fVar7;
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])(cti->m_normal).m_floats = auVar5;
    cti->m_offset =
         -((x->m_floats[2] - bVar6 * fVar7) * fVar7 +
          (x->m_floats[0] - bVar6 * fVar8) * fVar8 + (x->m_floats[1] - bVar6 * fVar9) * fVar9);
  }
  return bVar6 < 0.0;
}

Assistant:

bool				btSoftBody::checkContact(	const btCollisionObjectWrapper* colObjWrap,
											 const btVector3& x,
											 btScalar margin,
											 btSoftBody::sCti& cti) const
{
	btVector3 nrm;
	const btCollisionShape *shp = colObjWrap->getCollisionShape();
//	const btRigidBody *tmpRigid = btRigidBody::upcast(colObjWrap->getCollisionObject());
	//const btTransform &wtr = tmpRigid ? tmpRigid->getWorldTransform() : colObjWrap->getWorldTransform();
	const btTransform &wtr = colObjWrap->getWorldTransform();
	//todo: check which transform is needed here

	btScalar dst = 
		m_worldInfo->m_sparsesdf.Evaluate(	
			wtr.invXform(x),
			shp,
			nrm,
			margin);
	if(dst<0)
	{
		cti.m_colObj = colObjWrap->getCollisionObject();
		cti.m_normal = wtr.getBasis()*nrm;
		cti.m_offset = -btDot( cti.m_normal, x - cti.m_normal * dst );
		return(true);
	}
	return(false);
}